

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O1

string * __thiscall
jbcoin::STObject::getText_abi_cxx11_(string *__return_storage_ptr__,STObject *this)

{
  pointer pSVar1;
  pointer pSVar2;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"{","");
  pSVar2 = (this->v_).
           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl
           .super__Vector_impl_data._M_start;
  pSVar1 = (this->v_).
           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pSVar2 != pSVar1) {
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      (*pSVar2->p_->_vptr_STBase[6])(local_50);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      pSVar2 = pSVar2 + 1;
    } while (pSVar2 != pSVar1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string STObject::getText () const
{
    std::string ret = "{";
    bool first = false;
    for (auto const& elem : v_)
    {
        if (! first)
        {
            ret += ", ";
            first = false;
        }

        ret += elem->getText ();
    }
    ret += "}";
    return ret;
}